

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_sske(CPUS390XState_conflict *env,uint64_t r1,uint64_t r2)

{
  CPUState *pCVar1;
  undefined1 local_39;
  uint64_t uStack_38;
  uint8_t key;
  uint64_t addr;
  S390SKeysClass *skeyclass;
  S390SKeysState *ss;
  uint64_t r2_local;
  uint64_t r1_local;
  CPUS390XState_conflict *env_local;
  
  pCVar1 = env->uc->cpu;
  skeyclass = (S390SKeysClass *)(pCVar1[1].tb_jmp_cache + 0x1f9);
  addr = (uint64_t)pCVar1[1].tb_jmp_cache[0x1fc];
  ss = (S390SKeysState *)r2;
  r2_local = r1;
  r1_local = (uint64_t)env;
  uStack_38 = wrap_address(env,r2);
  local_39 = (undefined1)r2_local;
  (**(code **)(addr + 0x10))(skeyclass,uStack_38 >> 0xc,1,&local_39);
  pCVar1 = env_cpu((CPUArchState_conflict27 *)r1_local);
  tlb_flush_all_cpus_synced_s390x(pCVar1);
  return;
}

Assistant:

void HELPER(sske)(CPUS390XState *env, uint64_t r1, uint64_t r2)
{
    S390SKeysState *ss = (S390SKeysState *)(&((S390CPU *)env->uc->cpu)->ss);
    S390SKeysClass *skeyclass = S390_SKEYS_GET_CLASS(ss);
    uint64_t addr = wrap_address(env, r2);
    uint8_t key;

#if 0
    if (addr > ram_size) {
        return;
    }
#endif

    key = (uint8_t) r1;
    skeyclass->set_skeys(ss, addr / TARGET_PAGE_SIZE, 1, &key);
   /*
    * As we can only flush by virtual address and not all the entries
    * that point to a physical address we have to flush the whole TLB.
    */
    tlb_flush_all_cpus_synced(env_cpu(env));
}